

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O1

string * __thiscall
re2::FlattenedProgToString_abi_cxx11_(string *__return_storage_ptr__,re2 *this,Prog *prog,int start)

{
  Inst *this_00;
  long lVar1;
  undefined8 in_R8;
  undefined8 in_R9;
  ulong uVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  string local_50;
  
  paVar3 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)paVar3;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  if ((int)prog < *(int *)(this + 0x10)) {
    uVar2 = (ulong)(int)prog;
    lVar1 = uVar2 * 8;
    do {
      this_00 = (Inst *)(*(long *)(this + 0x48) + lVar1);
      if ((*(byte *)(*(long *)(this + 0x48) + lVar1) & 8) == 0) {
        Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
        StringAppendF(__return_storage_ptr__,"%d+ %s\n",uVar2 & 0xffffffff,local_50._M_dataplus._M_p
                      ,in_R8,in_R9,paVar3);
      }
      else {
        Prog::Inst::Dump_abi_cxx11_(&local_50,this_00);
        StringAppendF(__return_storage_ptr__,"%d. %s\n",uVar2 & 0xffffffff,local_50._M_dataplus._M_p
                      ,in_R8,in_R9,paVar3);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_50._M_dataplus._M_p != &local_50.field_2) {
        operator_delete(local_50._M_dataplus._M_p);
      }
      uVar2 = uVar2 + 1;
      lVar1 = lVar1 + 8;
    } while ((long)uVar2 < (long)*(int *)(this + 0x10));
  }
  return __return_storage_ptr__;
}

Assistant:

static string FlattenedProgToString(Prog* prog, int start) {
  string s;
  for (int id = start; id < prog->size(); id++) {
    Prog::Inst* ip = prog->inst(id);
    if (ip->last())
      StringAppendF(&s, "%d. %s\n", id, ip->Dump().c_str());
    else
      StringAppendF(&s, "%d+ %s\n", id, ip->Dump().c_str());
  }
  return s;
}